

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int AF_AActor_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage_00;
  AActor *target;
  AActor *missile_00;
  bool bVar1;
  bool local_4e;
  bool local_4b;
  AActor *missile;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cb,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cb,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  local_4b = true;
  if (target != (AActor *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
  }
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cb,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cc,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cc,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  damage_00 = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cd,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if ((param[2].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[2].field_0.field_1.atag != 1)) {
    bVar1 = param[2].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    missile_00 = (AActor *)param[2].field_0.field_1.a;
    local_4e = true;
    if (missile_00 != (AActor *)0x0) {
      local_4e = DObject::IsKindOf((DObject *)missile_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_4e != false) {
      if (missile_00 == (AActor *)0x0) {
        P_TraceBleed(damage_00,target);
      }
      else {
        P_TraceBleed(damage_00,target,missile_00);
      }
      return 0;
    }
    __assert_fail("missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cd,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12cd,
                "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_OBJECT(missile, AActor);

	if (missile) P_TraceBleed(damage, self, missile);
	else P_TraceBleed(damage, self);
	return 0;
}